

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunLoop.cpp
# Opt level: O1

Closure * __thiscall loop::RunLoop::quit_closure(Closure *__return_storage_ptr__,RunLoop *this)

{
  undefined8 *puVar1;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = quit;
  puVar1[1] = 0;
  puVar1[2] = this;
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar1;
  __return_storage_ptr__->_M_invoker =
       std::_Function_handler<void_(),_std::_Bind<void_(loop::RunLoop::*(loop::RunLoop_*))()>_>::
       _M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::_Function_handler<void_(),_std::_Bind<void_(loop::RunLoop::*(loop::RunLoop_*))()>_>::
       _M_manager;
  return __return_storage_ptr__;
}

Assistant:

Closure RunLoop::quit_closure()
{
    return std::bind(&RunLoop::quit, this);
}